

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEncProps_Normalize(CLzmaEncProps *p)

{
  int iVar1;
  bool bVar2;
  UInt32 local_18;
  int local_14;
  int level;
  CLzmaEncProps *p_local;
  
  local_14 = p->level;
  if (local_14 < 0) {
    local_14 = 5;
  }
  p->level = local_14;
  if (p->dictSize == 0) {
    if (local_14 < 6) {
      local_18 = 1 << ((char)(local_14 << 1) + 0xeU & 0x1f);
    }
    else {
      local_18 = 0x4000000;
      if (local_14 == 6) {
        local_18 = 0x2000000;
      }
    }
    p->dictSize = local_18;
  }
  if (p->lc < 0) {
    p->lc = 3;
  }
  if (p->lp < 0) {
    p->lp = 0;
  }
  if (p->pb < 0) {
    p->pb = 2;
  }
  if (p->algo < 0) {
    p->algo = (uint)(4 < local_14);
  }
  if (p->fb < 0) {
    iVar1 = 0x40;
    if (local_14 < 7) {
      iVar1 = 0x20;
    }
    p->fb = iVar1;
  }
  if (p->btMode < 0) {
    p->btMode = (uint)(p->algo != 0);
  }
  if (p->numHashBytes < 0) {
    p->numHashBytes = 4;
  }
  if (p->mc == 0) {
    p->mc = (p->fb >> 1) + 0x10 >> (p->btMode == 0);
  }
  if (p->numThreads < 0) {
    bVar2 = false;
    if (p->btMode != 0) {
      bVar2 = p->algo != 0;
    }
    iVar1 = 1;
    if (bVar2) {
      iVar1 = 2;
    }
    p->numThreads = iVar1;
  }
  return;
}

Assistant:

void LzmaEncProps_Normalize(CLzmaEncProps* p) {
  int level = p->level;
  if (level < 0)
    level = 5;
  p->level = level;
  if (p->dictSize == 0)
    p->dictSize = (level <= 5 ? (1 << (level * 2 + 14)) : (level == 6 ? (1 << 25) : (1 << 26)));
  if (p->lc < 0)
    p->lc = 3;
  if (p->lp < 0)
    p->lp = 0;
  if (p->pb < 0)
    p->pb = 2;
  if (p->algo < 0)
    p->algo = (level < 5 ? 0 : 1);
  if (p->fb < 0)
    p->fb = (level < 7 ? 32 : 64);
  if (p->btMode < 0)
    p->btMode = (p->algo == 0 ? 0 : 1);
  if (p->numHashBytes < 0)
    p->numHashBytes = 4;
  if (p->mc == 0)
    p->mc = (16 + (p->fb >> 1)) >> (p->btMode ? 0 : 1);
  if (p->numThreads < 0)
    p->numThreads = ((p->btMode && p->algo) ? 2 : 1);
}